

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

void moebius_values(int *n_data,int *n,int *c)

{
  int local_c8 [2];
  int n_vec [20];
  int c_vec [20];
  int *c_local;
  int *n_local;
  int *n_data_local;
  
  memcpy(n_vec + 0x12,&DAT_00265360,0x50);
  memcpy(local_c8,&DAT_002653b0,0x50);
  if (*n_data < 0) {
    *n_data = 0;
  }
  if (*n_data < 0x14) {
    *n = n_vec[(long)*n_data + -2];
    *c = n_vec[(long)*n_data + 0x12];
    *n_data = *n_data + 1;
  }
  else {
    *n_data = 0;
    *n = 0;
    *c = 0;
  }
  return;
}

Assistant:

void moebius_values ( int *n_data, int *n, int *c )

//****************************************************************************80
//
//  Purpose:
//
//    MOEBIUS_VALUES returns some values of the Moebius function.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    16 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input/output, int *N_DATA.
//    On input, if N_DATA is 0, the first test data is returned, and N_DATA
//    is set to 1.  On each subsequent call, the input value of N_DATA is
//    incremented and that test data item is returned, if available.  When
//    there is no more test data, N_DATA is set to 0.
//
//    Output, int *N, the argument of the Moebius function.
//
//    Output, int *C, the value of the Moebius function.
//
{
# define N_MAX 20

  int c_vec[N_MAX] = {
      1,  -1,  -1,   0,  -1,   1,  -1,   0,   0,   1, 
     -1,   0,  -1,   1,   1,   0,  -1,   0,  -1,   0 };

  int n_vec[N_MAX] = {
      1,   2,   3,   4,   5,   6,   7,   8,   9,  10, 
     11,  12,  13,  14,  15,  16,  17,  18,  19,  20 };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }

  if ( N_MAX <= *n_data )
  {
    *n_data = 0;
    *n = 0;
    *c = 0;
  }
  else
  {
    *n = n_vec[*n_data];
    *c = c_vec[*n_data];
    *n_data = *n_data + 1;
  }

  return;
# undef N_MAX
}